

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O2

Exception *
kj::getDestructionReason
          (Exception *__return_storage_ptr__,void *traceSeparator,Type defaultType,char *defaultFile
          ,int defaultLine,StringPtr defaultDescription)

{
  uint uVar1;
  Exception *pEVar2;
  long in_FS_OFFSET;
  StringPtr value;
  InFlightExceptionIterator local_58;
  InFlightExceptionIterator iter;
  Array<char> local_48;
  
  pEVar2 = (Exception *)(*(long *)(in_FS_OFFSET + -0x10) + 8);
  if (*(long *)(in_FS_OFFSET + -0x10) == 0) {
    pEVar2 = (Exception *)0x0;
  }
  iter.ptr = pEVar2;
  InFlightExceptionIterator::next(&local_58);
  if (local_58.ptr == (Exception *)0x0) {
    value.content.size_ = (size_t)pEVar2;
    value.content.ptr = (char *)defaultDescription.content.size_;
    heapString((String *)&local_48,(kj *)defaultDescription.content.ptr,value);
    Exception::Exception
              (__return_storage_ptr__,defaultType,defaultFile,defaultLine,(String *)&local_48);
    Array<char>::~Array(&local_48);
    Exception::extendTrace(__return_storage_ptr__,2,0x10);
    uVar1 = __return_storage_ptr__->traceCount;
    if ((ulong)uVar1 < 0x20) {
      __return_storage_ptr__->traceCount = uVar1 + 1;
      __return_storage_ptr__->trace[uVar1] = traceSeparator;
    }
  }
  else {
    Exception::Exception(__return_storage_ptr__,local_58.ptr);
    Exception::truncateCommonTrace(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Exception getDestructionReason(void* traceSeparator, kj::Exception::Type defaultType,
    const char* defaultFile, int defaultLine, kj::StringPtr defaultDescription) {
  InFlightExceptionIterator iter;
  KJ_IF_SOME(e, iter.next()) {
    auto copy = kj::cp(e);
    copy.truncateCommonTrace();
    return copy;
  } else {
    // Darn, use a generic exception.
    kj::Exception exception(defaultType, defaultFile, defaultLine,
        kj::heapString(defaultDescription));

    // Let's give some context on where the PromiseFulfiller was destroyed.
    exception.extendTrace(2, 16);

    // Add a separator that hopefully makes this understandable...
    exception.addTrace(traceSeparator);

    return exception;
  }